

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataLisp.cpp
# Opt level: O0

void DL::DataLisp_Internal::deleteNode(ValueNode *n)

{
  ValueNode *n_local;
  
  if (n != (ValueNode *)0x0) {
    if (n->Type == VNT_Statement) {
      deleteNode((n->field_1)._Statement);
    }
    else if (n->Type == VNT_Expression) {
      deleteNode((n->field_1)._Expression);
    }
    if (n != (ValueNode *)0x0) {
      ValueNode::~ValueNode(n);
      operator_delete(n,0x30);
    }
  }
  return;
}

Assistant:

static void deleteNode(ValueNode* n)
	{
		if (!n)
			return;

		if (n->Type == VNT_Statement)
			deleteNode(n->_Statement);
		else if (n->Type == VNT_Expression)
			deleteNode(n->_Expression);

		delete n;
	}